

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient4d(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,double bheight
               ,double cheight,double dheight,double eheight)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  dVar1 = *pe;
  dVar15 = pe[1];
  dVar3 = *pa - dVar1;
  dVar18 = *pb - dVar1;
  dVar16 = *pc - dVar1;
  dVar1 = *pd - dVar1;
  dVar17 = pa[1] - dVar15;
  dVar13 = pb[1] - dVar15;
  dVar8 = pc[1] - dVar15;
  dVar15 = pd[1] - dVar15;
  dVar10 = pe[2];
  dVar6 = pa[2] - dVar10;
  dVar11 = pb[2] - dVar10;
  dVar9 = pc[2] - dVar10;
  dVar10 = pd[2] - dVar10;
  dVar5 = dVar18 * dVar8 - dVar16 * dVar13;
  dVar4 = dVar8 * dVar3 - dVar17 * dVar16;
  dVar2 = dVar3 * dVar13 - dVar18 * dVar17;
  dVar14 = dVar16 * dVar15 - dVar1 * dVar8;
  dVar7 = dVar15 * dVar18 - dVar13 * dVar1;
  dVar12 = dVar1 * dVar17 - dVar3 * dVar15;
  dVar5 = ((dVar14 * dVar6 + dVar9 * dVar12 + dVar4 * dVar10) * (bheight - eheight) -
          (dVar5 * dVar10 + (dVar11 * dVar14 - dVar7 * dVar9)) * (aheight - eheight)) +
          ((dVar9 * dVar2 + (dVar6 * dVar5 - dVar4 * dVar11)) * (dheight - eheight) -
          (dVar12 * dVar11 + dVar2 * dVar10 + dVar6 * dVar7) * (cheight - eheight));
  dVar4 = ABS(dVar1 * dVar8) + ABS(dVar16 * dVar15);
  dVar2 = ABS(dVar13 * dVar1) + ABS(dVar15 * dVar18);
  dVar11 = ABS(dVar11);
  dVar9 = ABS(dVar9);
  dVar7 = ABS(dVar16 * dVar13) + ABS(dVar18 * dVar8);
  dVar10 = ABS(dVar10);
  dVar12 = ABS(dVar3 * dVar15) + ABS(dVar1 * dVar17);
  dVar1 = ABS(dVar17 * dVar16) + ABS(dVar8 * dVar3);
  dVar6 = ABS(dVar6);
  dVar15 = ABS(dVar18 * dVar17) + ABS(dVar3 * dVar13);
  dVar15 = ABS(dheight - eheight) * (dVar15 * dVar9 + dVar7 * dVar6 + dVar1 * dVar11) +
           ABS(cheight - eheight) * (dVar12 * dVar11 + dVar10 * dVar15 + dVar2 * dVar6) +
           ABS(aheight - eheight) * (dVar7 * dVar10 + dVar4 * dVar11 + dVar2 * dVar9) +
           ABS(bheight - eheight) * (dVar4 * dVar6 + dVar12 * dVar9 + dVar1 * dVar10);
  dVar1 = isperrboundA * dVar15;
  if ((dVar5 <= dVar1) && (-dVar5 <= dVar1)) {
    dVar1 = orient4dadapt(pa,pb,pc,pd,pe,aheight,bheight,cheight,dheight,eheight,dVar15);
    return dVar1;
  }
  return dVar5;
}

Assistant:

REAL orient4d(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe, 
              REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
              REAL eheight)
{
 REAL aex, bex, cex, dex;
 REAL aey, bey, cey, dey;
 REAL aez, bez, cez, dez;
 REAL aexbey, bexaey, bexcey, cexbey, cexdey, dexcey, dexaey, aexdey;
 REAL aexcey, cexaey, bexdey, dexbey;
 REAL aeheight, beheight, ceheight, deheight;
 REAL ab, bc, cd, da, ac, bd;
 REAL abc, bcd, cda, dab;
 REAL aezplus, bezplus, cezplus, dezplus;
 REAL aexbeyplus, bexaeyplus, bexceyplus, cexbeyplus;
 REAL cexdeyplus, dexceyplus, dexaeyplus, aexdeyplus;
 REAL aexceyplus, cexaeyplus, bexdeyplus, dexbeyplus;
 REAL det;
 REAL permanent, errbound;


 aex = pa[0] - pe[0];
 bex = pb[0] - pe[0];
 cex = pc[0] - pe[0];
 dex = pd[0] - pe[0];
 aey = pa[1] - pe[1];
 bey = pb[1] - pe[1];
 cey = pc[1] - pe[1];
 dey = pd[1] - pe[1];
 aez = pa[2] - pe[2];
 bez = pb[2] - pe[2];
 cez = pc[2] - pe[2];
 dez = pd[2] - pe[2];
 aeheight = aheight - eheight;
 beheight = bheight - eheight;
 ceheight = cheight - eheight;
 deheight = dheight - eheight;

 aexbey = aex * bey;
 bexaey = bex * aey;
 ab = aexbey - bexaey;
 bexcey = bex * cey;
 cexbey = cex * bey;
 bc = bexcey - cexbey;
 cexdey = cex * dey;
 dexcey = dex * cey;
 cd = cexdey - dexcey;
 dexaey = dex * aey;
 aexdey = aex * dey;
 da = dexaey - aexdey;

 aexcey = aex * cey;
 cexaey = cex * aey;
 ac = aexcey - cexaey;
 bexdey = bex * dey;
 dexbey = dex * bey;
 bd = bexdey - dexbey;

 abc = aez * bc - bez * ac + cez * ab;
 bcd = bez * cd - cez * bd + dez * bc;
 cda = cez * da + dez * ac + aez * cd;
 dab = dez * ab + aez * bd + bez * da;

 det = (deheight * abc - ceheight * dab) + (beheight * cda - aeheight * bcd);

 aezplus = Absolute(aez);
 bezplus = Absolute(bez);
 cezplus = Absolute(cez);
 dezplus = Absolute(dez);
 aexbeyplus = Absolute(aexbey);
 bexaeyplus = Absolute(bexaey);
 bexceyplus = Absolute(bexcey);
 cexbeyplus = Absolute(cexbey);
 cexdeyplus = Absolute(cexdey);
 dexceyplus = Absolute(dexcey);
 dexaeyplus = Absolute(dexaey);
 aexdeyplus = Absolute(aexdey);
 aexceyplus = Absolute(aexcey);
 cexaeyplus = Absolute(cexaey);
 bexdeyplus = Absolute(bexdey);
 dexbeyplus = Absolute(dexbey);
 permanent = ((cexdeyplus + dexceyplus) * bezplus
              + (dexbeyplus + bexdeyplus) * cezplus
              + (bexceyplus + cexbeyplus) * dezplus)
           * Absolute(aeheight)
           + ((dexaeyplus + aexdeyplus) * cezplus
              + (aexceyplus + cexaeyplus) * dezplus
              + (cexdeyplus + dexceyplus) * aezplus)
           * Absolute(beheight)
           + ((aexbeyplus + bexaeyplus) * dezplus
              + (bexdeyplus + dexbeyplus) * aezplus
              + (dexaeyplus + aexdeyplus) * bezplus)
           * Absolute(ceheight)
           + ((bexceyplus + cexbeyplus) * aezplus
              + (cexaeyplus + aexceyplus) * bezplus
              + (aexbeyplus + bexaeyplus) * cezplus)
           * Absolute(deheight);
 errbound = isperrboundA * permanent;
 if ((det > errbound) || (-det > errbound)) {
   return det;
 }

 return orient4dadapt(pa, pb, pc, pd, pe,
                      aheight, bheight, cheight, dheight, eheight, permanent);
}